

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int vm_builtin_func_get_arg(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  jx9_vm *pVm;
  VmFrame *pVVar2;
  uint *puVar3;
  jx9_value *pjVar4;
  jx9_value *pSrc;
  
  pVm = pCtx->pVm;
  if ((nArg < 1) || (pVVar2 = pVm->pFrame, pVVar2->pParent == (VmFrame *)0x0)) {
    jx9VmThrowError(pVm,&pCtx->pFunc->sName,2,"Called in the global scope");
  }
  else {
    pjVar4 = *apArg;
    jx9MemObjToInteger(pjVar4);
    uVar1 = *(uint *)&pjVar4->x;
    if ((-1 < (int)uVar1) && ((int)uVar1 < (int)(pVVar2->sArg).nUsed)) {
      if (uVar1 < (pVVar2->sArg).nUsed) {
        puVar3 = (uint *)((ulong)(uVar1 * (pVVar2->sArg).eSize) + (long)(pVVar2->sArg).pBase);
      }
      else {
        puVar3 = (uint *)0x0;
      }
      if (puVar3 != (uint *)0x0) {
        if (*puVar3 < (pVm->aMemObj).nUsed) {
          pSrc = (jx9_value *)((ulong)(*puVar3 * (pVm->aMemObj).eSize) + (long)(pVm->aMemObj).pBase)
          ;
        }
        else {
          pSrc = (jx9_value *)0x0;
        }
        pjVar4 = pCtx->pRet;
        if (pSrc != (jx9_value *)0x0) {
          jx9MemObjStore(pSrc,pjVar4);
          return 0;
        }
        goto LAB_0012b8ab;
      }
    }
  }
  pjVar4 = pCtx->pRet;
LAB_0012b8ab:
  jx9MemObjRelease(pjVar4);
  (pjVar4->x).rVal = 0.0;
  pjVar4->iFlags = pjVar4->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int vm_builtin_func_get_arg(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pObj = 0;
	VmSlot *pSlot = 0;
	VmFrame *pFrame;
	jx9_vm *pVm;
	/* Point to the target VM */
	pVm = pCtx->pVm;
	/* Current frame */
	pFrame = pVm->pFrame;
	if( nArg < 1 || pFrame->pParent == 0 ){
		/* Global frame or Missing arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Called in the global scope");
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	/* Extract the desired index */
	nArg = jx9_value_to_int(apArg[0]);
	if( nArg < 0 || nArg >= (int)SySetUsed(&pFrame->sArg) ){
		/* Invalid index, return FALSE */
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	/* Extract the desired argument */
	if( (pSlot = (VmSlot *)SySetAt(&pFrame->sArg, (sxu32)nArg)) != 0 ){
		if( (pObj = (jx9_value *)SySetAt(&pVm->aMemObj, pSlot->nIdx)) != 0 ){
			/* Return the desired argument */
			jx9_result_value(pCtx, (jx9_value *)pObj);
		}else{
			/* No such argument, return false */
			jx9_result_bool(pCtx, 0);
		}
	}else{
		/* CAN'T HAPPEN */
		jx9_result_bool(pCtx, 0);
	}
	return SXRET_OK;
}